

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printAll(PrinterStream *this)

{
  pool_ref<soul::heart::Variable> *ppVar1;
  size_t sVar2;
  ModuleType MVar3;
  string *__x;
  Module *pMVar4;
  long lVar5;
  Indent indent;
  
  ppVar1 = (this->module->stateVariables).stateVariables.items;
  sVar2 = (this->module->stateVariables).stateVariables.numActive;
  for (lVar5 = 0; sVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
    __x = Identifier::operator_cast_to_string_
                    ((Identifier *)(*(long *)((long)&ppVar1->object + lVar5) + 0x30));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->allVisibleVariables,__x);
  }
  pMVar4 = this->module;
  MVar3 = pMVar4->moduleType;
  if (MVar3 == processorModule) {
    choc::text::CodePrinter::operator<<(this->out,"processor ");
    pMVar4 = this->module;
    MVar3 = pMVar4->moduleType;
  }
  if (MVar3 == graphModule) {
    choc::text::CodePrinter::operator<<(this->out,"graph ");
    pMVar4 = this->module;
    MVar3 = pMVar4->moduleType;
  }
  if (MVar3 == namespaceModule) {
    choc::text::CodePrinter::operator<<(this->out,"namespace ");
    pMVar4 = this->module;
  }
  choc::text::CodePrinter::operator<<(this->out,&pMVar4->fullName);
  printDescription(this,&this->module->annotation);
  choc::text::CodePrinter::startNewLine(this->out);
  choc::text::CodePrinter::createIndentWithBraces((CodePrinter *)&indent,(size_t)this->out);
  if (this->module->moduleType != namespaceModule) {
    printInputs(this);
    printOutputs(this);
    choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  }
  printNodes(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printConnections(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printLatency(this);
  printStateVariables(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printStructs(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printFunctions(this);
  choc::text::CodePrinter::Indent::~Indent(&indent);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  return;
}

Assistant:

void printAll()
        {
            for (auto& v : module.stateVariables.get())
                allVisibleVariables.push_back (v->name);

            if (module.isProcessor())   out << "processor ";
            if (module.isGraph())       out << "graph ";
            if (module.isNamespace())   out << "namespace ";

            out << module.fullName;
            printDescription (module.annotation);
            out << newLine;

            {
                auto indent = out.createIndentWithBraces (2);

                if (! module.isNamespace())
                {
                    printInputs();
                    printOutputs();
                    out << blankLine;
                }

                printNodes();
                out << blankLine;
                printConnections();
                out << blankLine;
                printLatency();
                printStateVariables();
                out << blankLine;
                printStructs();
                out << blankLine;
                printFunctions();
            }

            out << blankLine;
        }